

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

char * httplib::detail::find_content_type
                 (string *path,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *user_data)

{
  uint uVar1;
  const_iterator cVar2;
  char *pcVar3;
  string ext;
  string local_30;
  char *pcVar4;
  
  file_extension(&local_30,path);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&user_data->_M_t,&local_30);
  if ((_Rb_tree_header *)cVar2._M_node != &(user_data->_M_t)._M_impl.super__Rb_tree_header) {
    pcVar3 = *(char **)(cVar2._M_node + 2);
    goto LAB_00146827;
  }
  uVar1 = str2tag_core(local_30._M_dataplus._M_p,local_30._M_string_length,0);
  pcVar4 = (char *)0x0;
  pcVar3 = (char *)0x0;
  if ((int)uVar1 < 0x1f164) {
    if ((int)uVar1 < 0x1d1b9) {
      if (0x1a6de < (int)uVar1) {
        if (0x1c97c < (int)uVar1) {
          if (uVar1 != 0x1c97d) {
            if (uVar1 == 0x1cb45) {
              pcVar3 = "image/x-icon";
            }
            else {
              pcVar3 = pcVar4;
              if (uVar1 == 0x1d0f2) {
                pcVar3 = "application/pdf";
              }
            }
            goto LAB_00146827;
          }
LAB_00146aaf:
          pcVar3 = "image/jpeg";
          goto LAB_00146827;
        }
        if (uVar1 == 0x1a6df) {
          pcVar3 = "image/bmp";
          goto LAB_00146827;
        }
        if (uVar1 != 0x1b0f1) {
          pcVar3 = pcVar4;
          if (uVar1 == 0x1b288) {
            pcVar3 = "image/gif";
          }
          goto LAB_00146827;
        }
LAB_00146ba5:
        pcVar3 = "text/html";
        goto LAB_00146827;
      }
      if ((int)uVar1 < 0xdd9) {
        if (uVar1 == 0x76d) {
          pcVar3 = "application/x-7z-compressed";
        }
        else if (uVar1 == 0xd3d) {
          pcVar3 = "application/gzip";
        }
        goto LAB_00146827;
      }
      if (uVar1 != 0xdd9) {
        if (uVar1 == 0x1a2c3) {
          pcVar3 = "text/css";
        }
        else {
          pcVar3 = pcVar4;
          if (uVar1 == 0x1a2c6) {
            pcVar3 = "text/csv";
          }
        }
        goto LAB_00146827;
      }
    }
    else {
      if (0x1dee5 < (int)uVar1) {
        if ((int)uVar1 < 0x1e25b) {
          if (uVar1 == 0x1dee6) {
            pcVar3 = "font/ttf";
          }
          else if (uVar1 == 0x1e078) {
            pcVar3 = "text/plain";
          }
          else if (uVar1 == 0x1e147) {
            pcVar3 = "application/x-tar";
          }
          goto LAB_00146827;
        }
        if (uVar1 != 0x1e25b) {
          if (uVar1 == 0x1e322) {
            pcVar3 = "image/svg+xml";
          }
          else if (uVar1 == 0x1e692) {
            pcVar3 = "application/rss+xml";
          }
          goto LAB_00146827;
        }
LAB_00146bb1:
        pcVar3 = "image/tiff";
        goto LAB_00146827;
      }
      if ((int)uVar1 < 0x1db34) {
        if (uVar1 == 0x1d1b9) {
          pcVar3 = "image/png";
        }
        else if (uVar1 == 0x1d5fd) {
          pcVar3 = "font/otf";
        }
        goto LAB_00146827;
      }
      if (uVar1 != 0x1db34) {
        if (uVar1 == 0x1de29) {
          pcVar3 = "video/mp4";
        }
        else if (uVar1 == 0x1de2e) {
          pcVar3 = "audio/mp3";
        }
        goto LAB_00146827;
      }
    }
    pcVar3 = "text/javascript";
  }
  else {
    if ((int)uVar1 < 0x3dad1f) {
      if (0x371b37 < (int)uVar1) {
        if ((int)uVar1 < 0x37cf7d) {
          if (uVar1 == 0x371b38) {
            pcVar3 = "image/apng";
          }
          else if (uVar1 == 0x372318) {
            pcVar3 = "image/avif";
          }
          else if (uVar1 == 0x372b57) {
            pcVar3 = "application/atom+xml";
          }
          goto LAB_00146827;
        }
        if (uVar1 != 0x37cf7d) {
          if (uVar1 == 0x3adb38) {
            pcVar3 = "application/json";
            goto LAB_00146827;
          }
          if (uVar1 != 0x3af938) goto LAB_00146827;
          goto LAB_00146aaf;
        }
        goto LAB_00146ba5;
      }
      if (0x1f57f < (int)uVar1) {
        if (uVar1 == 0x1f580) {
          pcVar3 = "audio/wave";
        }
        else if (uVar1 == 0x1f7f6) {
          pcVar3 = "text/vtt";
        }
        else if (uVar1 == 0x20a43) {
          pcVar3 = "application/zip";
        }
        goto LAB_00146827;
      }
      if (uVar1 != 0x1f164) {
        if (uVar1 == 0x1f1d9) {
          pcVar3 = "application/xml";
        }
        goto LAB_00146827;
      }
    }
    else {
      if ((int)uVar1 < 0x409771) {
        if ((int)uVar1 < 0x3e2ddd) {
          if (uVar1 == 0x3dad1f) {
            pcVar3 = "video/mpeg";
          }
          else if (uVar1 == 0x3daddb) {
            pcVar3 = "audio/mpeg";
          }
          goto LAB_00146827;
        }
        if (uVar1 != 0x3e2ddd) {
          if (uVar1 == 0x3ff093) {
            pcVar3 = "application/xslt+xml";
          }
          else if (uVar1 == 0x409760) {
            pcVar3 = "image/webp";
          }
          goto LAB_00146827;
        }
        goto LAB_00146bb1;
      }
      if ((int)uVar1 < 0x40c278) {
        if (uVar1 == 0x409771) {
          pcVar3 = "audio/webm";
        }
        else if (uVar1 == 0x40977d) {
          pcVar3 = "video/webm";
        }
        else if (uVar1 == 0x40a648) {
          pcVar3 = "application/wasm";
        }
        goto LAB_00146827;
      }
      if (uVar1 == 0x40c278) {
        pcVar3 = "font/woff";
        goto LAB_00146827;
      }
      if (uVar1 != 0x843cec5) {
        if (uVar1 == 0x859114a) {
          pcVar3 = "font/woff2";
        }
        goto LAB_00146827;
      }
    }
    pcVar3 = "application/xhtml+xml";
  }
LAB_00146827:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pcVar3;
}

Assistant:

inline const char *
find_content_type(const std::string &path,
                  const std::map<std::string, std::string> &user_data) {
  auto ext = file_extension(path);

  auto it = user_data.find(ext);
  if (it != user_data.end()) { return it->second.c_str(); }

  using udl::operator""_t;

  switch (str2tag(ext)) {
  default: return nullptr;
  case "css"_t: return "text/css";
  case "csv"_t: return "text/csv";
  case "htm"_t:
  case "html"_t: return "text/html";
  case "js"_t:
  case "mjs"_t: return "text/javascript";
  case "txt"_t: return "text/plain";
  case "vtt"_t: return "text/vtt";

  case "apng"_t: return "image/apng";
  case "avif"_t: return "image/avif";
  case "bmp"_t: return "image/bmp";
  case "gif"_t: return "image/gif";
  case "png"_t: return "image/png";
  case "svg"_t: return "image/svg+xml";
  case "webp"_t: return "image/webp";
  case "ico"_t: return "image/x-icon";
  case "tif"_t: return "image/tiff";
  case "tiff"_t: return "image/tiff";
  case "jpg"_t:
  case "jpeg"_t: return "image/jpeg";

  case "mp4"_t: return "video/mp4";
  case "mpeg"_t: return "video/mpeg";
  case "webm"_t: return "video/webm";

  case "mp3"_t: return "audio/mp3";
  case "mpga"_t: return "audio/mpeg";
  case "weba"_t: return "audio/webm";
  case "wav"_t: return "audio/wave";

  case "otf"_t: return "font/otf";
  case "ttf"_t: return "font/ttf";
  case "woff"_t: return "font/woff";
  case "woff2"_t: return "font/woff2";

  case "7z"_t: return "application/x-7z-compressed";
  case "atom"_t: return "application/atom+xml";
  case "pdf"_t: return "application/pdf";
  case "json"_t: return "application/json";
  case "rss"_t: return "application/rss+xml";
  case "tar"_t: return "application/x-tar";
  case "xht"_t:
  case "xhtml"_t: return "application/xhtml+xml";
  case "xslt"_t: return "application/xslt+xml";
  case "xml"_t: return "application/xml";
  case "gz"_t: return "application/gzip";
  case "zip"_t: return "application/zip";
  case "wasm"_t: return "application/wasm";
  }
}